

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress(void *dst,size_t dstSize,void *cSrc,size_t cSrcSize)

{
  U32 UVar1;
  size_t sVar2;
  size_t sStack_30;
  
  if (dstSize == 0) {
    sStack_30 = 0xffffffffffffffba;
    dstSize = sStack_30;
  }
  else if (dstSize < cSrcSize) {
    sStack_30 = 0xffffffffffffffec;
    dstSize = sStack_30;
  }
  else if (cSrcSize == dstSize) {
    memcpy(dst,cSrc,dstSize);
  }
  else {
    if (cSrcSize != 1) {
      UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
      sVar2 = (*HUF_decompress::decompress[UVar1])(dst,dstSize,cSrc,cSrcSize);
      return sVar2;
    }
    memset(dst,(uint)*cSrc,dstSize);
  }
  return dstSize;
}

Assistant:

size_t HUF_decompress (void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize)
{
#if !defined(HUF_FORCE_DECOMPRESS_X1) && !defined(HUF_FORCE_DECOMPRESS_X2)
    static const decompressionAlgo decompress[2] = { HUF_decompress4X1, HUF_decompress4X2 };
#endif

    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress4X1(dst, dstSize, cSrc, cSrcSize);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress4X2(dst, dstSize, cSrc, cSrcSize);
#else
        return decompress[algoNb](dst, dstSize, cSrc, cSrcSize);
#endif
    }
}